

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O1

void __thiscall
embree::SharedLazyTessellationCache::SharedLazyTessellationCache(SharedLazyTessellationCache *this)

{
  undefined8 *puVar1;
  ThreadWorkState *pTVar2;
  long lVar3;
  
  lVar3 = 0;
  (this->reset_state).flag.super_atomic<bool>._M_base._M_i = false;
  (this->linkedlist_mtx).flag.super_atomic<bool>._M_base._M_i = false;
  this->data = (float *)0x0;
  this->hugepages = false;
  this->size = 0;
  this->maxBlocks = 0;
  LOCK();
  (this->localTime).super___atomic_base<unsigned_long>._M_i = 8;
  UNLOCK();
  LOCK();
  (this->next_block).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->numRenderThreads).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->switch_block_threshold).super___atomic_base<unsigned_long>._M_i = this->maxBlocks >> 3;
  UNLOCK();
  pTVar2 = (ThreadWorkState *)alignedMalloc(0x8000,0x40);
  do {
    puVar1 = (undefined8 *)
             ((long)&(pTVar2->counter).super___atomic_base<unsigned_long>._M_i + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    (&pTVar2->allocated)[lVar3] = false;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x8000);
  this->threadWorkState = pTVar2;
  return;
}

Assistant:

SharedLazyTessellationCache::SharedLazyTessellationCache()
  {
    size = 0;
    data = nullptr;
    hugepages = false;
    maxBlocks              = size/BLOCK_SIZE;
    localTime              = NUM_CACHE_SEGMENTS;
    next_block             = 0;
    numRenderThreads       = 0;
#if FORCE_SIMPLE_FLUSH == 1
    switch_block_threshold = maxBlocks;
#else
    switch_block_threshold = maxBlocks/NUM_CACHE_SEGMENTS;
#endif
    threadWorkState     = new ThreadWorkState[NUM_PREALLOC_THREAD_WORK_STATES];

    //reset_state.reset();
    //linkedlist_mtx.reset();
  }